

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O2

void __thiscall llvm::APFloat::Storage::~Storage(Storage *this)

{
  fltSemantics *pfVar1;
  fltSemantics *pfVar2;
  
  pfVar1 = *(fltSemantics **)this;
  pfVar2 = APFloatBase::PPCDoubleDouble();
  if (pfVar2 != pfVar1) {
    detail::IEEEFloat::~IEEEFloat((IEEEFloat *)this);
    return;
  }
  std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::~unique_ptr
            ((unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_> *)(this + 8));
  return;
}

Assistant:

~Storage() {
      if (usesLayout<IEEEFloat>(*semantics)) {
        IEEE.~IEEEFloat();
        return;
      }
      if (usesLayout<DoubleAPFloat>(*semantics)) {
        Double.~DoubleAPFloat();
        return;
      }
      llvm_unreachable("Unexpected semantics");
    }